

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jobjectArray
Java_beagle_BeagleJNIWrapper_getBenchmarkedResourceList
          (JNIEnv *env,jobject obj,jint tipCount,jint compactBufferCount,jint stateCount,
          jint patternCount,jint categoryCount,jintArray inResourceList,jint resourceCount,
          jlong preferenceFlags,jlong requirementFlags,jint eigenModelCount,jint partitionCount,
          jint calculateDerivatives,jlong benchmarkFlags)

{
  long *plVar1;
  jclass clazz;
  jmethodID methodID;
  jmethodID methodID_00;
  jmethodID methodID_01;
  jmethodID methodID_02;
  jmethodID methodID_03;
  jmethodID methodID_04;
  jmethodID methodID_05;
  jmethodID methodID_06;
  jmethodID methodID_07;
  jmethodID p_Var2;
  jmethodID p_Var3;
  jobject obj_00;
  jstring p_Var4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  jobject in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  long in_stack_00000010;
  undefined4 in_stack_00000018;
  jclass in_stack_00000020;
  jclass in_stack_00000028;
  undefined4 in_stack_00000030;
  jstring jString;
  jobject benchmarkedResourceObj;
  int i;
  jobjectArray benchmarkedResourceArray;
  jmethodID setPerformanceRatioMethodID;
  jmethodID setBenchmarkResultMethodID;
  jmethodID setBenchedFlagsMethodID;
  jmethodID setImplNameMethodID;
  jmethodID setReturnCodeMethodID;
  jmethodID setRequiredFlagsMethodID;
  jmethodID setSupportFlagsMethodID;
  jmethodID setDescriptionMethodID;
  jmethodID setNameMethodID;
  jmethodID setResourceNumberMethodID;
  jmethodID constructorMethodID;
  jclass objClass;
  BeagleBenchmarkedResourceList *brl;
  jint *resourceList;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  JNIEnv_ *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff04;
  uint local_c4;
  jint *pjVar5;
  jobjectArray local_28;
  
  pjVar5 = (jint *)0x0;
  if (in_stack_00000010 != 0) {
    pjVar5 = JNIEnv_::GetIntArrayElements
                       (in_stack_fffffffffffffef0,
                        (jintArray)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (jboolean *)0x1038ae);
  }
  plVar1 = (long *)beagleGetBenchmarkedResourceList
                             (in_EDX,in_ECX,in_R8D,in_R9D,in_stack_00000008,pjVar5);
  if (plVar1 == (long *)0x0) {
    local_28 = (jobjectArray)0x0;
  }
  else {
    clazz = JNIEnv_::FindClass((JNIEnv_ *)in_stack_00000020,
                               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_00000018));
    if (clazz == (jclass)0x0) {
      printf("NULL returned in FindClass: can\'t find class: beagle/BenchmarkedResourceDetails\n");
      local_28 = (jobjectArray)0x0;
    }
    else {
      methodID = JNIEnv_::GetMethodID
                           ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030),
                            in_stack_00000028,(char *)in_stack_00000020,
                            (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_00000018));
      if (methodID == (jmethodID)0x0) {
        printf(
              "NULL returned in FindClass: can\'t find constructor for class: beagle/BenchmarkedResourceDetails\n"
              );
        local_28 = (jobjectArray)0x0;
      }
      else {
        methodID_00 = JNIEnv_::GetMethodID
                                ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030),
                                 in_stack_00000028,(char *)in_stack_00000020,
                                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_00000018));
        if (methodID_00 == (jmethodID)0x0) {
          printf(
                "NULL returned in FindClass: can\'t find \'setResourceNumber\' method in class: beagle/BenchmarkedResourceDetails\n"
                );
          local_28 = (jobjectArray)0x0;
        }
        else {
          methodID_01 = JNIEnv_::GetMethodID
                                  ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030),
                                   in_stack_00000028,(char *)in_stack_00000020,
                                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_00000018));
          if (methodID_01 == (jmethodID)0x0) {
            printf(
                  "NULL returned in FindClass: can\'t find \'setName\' method in class: beagle/BenchmarkedResourceDetails\n"
                  );
            local_28 = (jobjectArray)0x0;
          }
          else {
            methodID_02 = JNIEnv_::GetMethodID
                                    ((JNIEnv_ *)
                                     CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030),
                                     in_stack_00000028,(char *)in_stack_00000020,
                                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_00000018));
            if (methodID_02 == (jmethodID)0x0) {
              printf(
                    "NULL returned in FindClass: can\'t find \'setDescription\' method in class: beagle/BenchmarkedResourceDetails\n"
                    );
              local_28 = (jobjectArray)0x0;
            }
            else {
              methodID_03 = JNIEnv_::GetMethodID
                                      ((JNIEnv_ *)
                                       CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030),
                                       in_stack_00000028,(char *)in_stack_00000020,
                                       (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_00000018)
                                      );
              if (methodID_03 == (jmethodID)0x0) {
                printf(
                      "NULL returned in FindClass: can\'t find \'setSupportFlags\' method in class: beagle/BenchmarkedResourceDetails\n"
                      );
                local_28 = (jobjectArray)0x0;
              }
              else {
                methodID_04 = JNIEnv_::GetMethodID
                                        ((JNIEnv_ *)
                                         CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030),
                                         in_stack_00000028,(char *)in_stack_00000020,
                                         (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                          in_stack_00000018));
                if (methodID_04 == (jmethodID)0x0) {
                  printf(
                        "NULL returned in FindClass: can\'t find \'setRequiredFlags\' method in class: beagle/BenchmarkedResourceDetails\n"
                        );
                  local_28 = (jobjectArray)0x0;
                }
                else {
                  methodID_05 = JNIEnv_::GetMethodID
                                          ((JNIEnv_ *)
                                           CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030),
                                           in_stack_00000028,(char *)in_stack_00000020,
                                           (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                            in_stack_00000018));
                  if (methodID_05 == (jmethodID)0x0) {
                    printf(
                          "NULL returned in FindClass: can\'t find \'setReturnCode\' method in class: beagle/BenchmarkedResourceDetails\n"
                          );
                    local_28 = (jobjectArray)0x0;
                  }
                  else {
                    methodID_06 = JNIEnv_::GetMethodID
                                            ((JNIEnv_ *)
                                             CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030),
                                             in_stack_00000028,(char *)in_stack_00000020,
                                             (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                              in_stack_00000018));
                    if (methodID_06 == (jmethodID)0x0) {
                      printf(
                            "NULL returned in FindClass: can\'t find \'setImplName\' method in class: beagle/BenchmarkedResourceDetails\n"
                            );
                      local_28 = (jobjectArray)0x0;
                    }
                    else {
                      methodID_07 = JNIEnv_::GetMethodID
                                              ((JNIEnv_ *)
                                               CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030)
                                               ,in_stack_00000028,(char *)in_stack_00000020,
                                               (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                                in_stack_00000018));
                      if (methodID_07 == (jmethodID)0x0) {
                        printf(
                              "NULL returned in FindClass: can\'t find \'setBenchedFlags\' method in class: beagle/BenchmarkedResourceDetails\n"
                              );
                        local_28 = (jobjectArray)0x0;
                      }
                      else {
                        p_Var2 = JNIEnv_::GetMethodID
                                           ((JNIEnv_ *)
                                            CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030),
                                            in_stack_00000028,(char *)in_stack_00000020,
                                            (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                             in_stack_00000018));
                        if (p_Var2 == (jmethodID)0x0) {
                          printf(
                                "NULL returned in FindClass: can\'t find \'setBenchmarkResult\' method in class: beagle/BenchmarkedResourceDetails\n"
                                );
                          local_28 = (jobjectArray)0x0;
                        }
                        else {
                          p_Var3 = JNIEnv_::GetMethodID
                                             ((JNIEnv_ *)
                                              CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030),
                                              in_stack_00000028,(char *)in_stack_00000020,
                                              (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                               in_stack_00000018));
                          if (p_Var3 == (jmethodID)0x0) {
                            printf(
                                  "NULL returned in FindClass: can\'t find \'setPerformanceRatio\' method in class: beagle/BenchmarkedResourceDetails\n"
                                  );
                            local_28 = (jobjectArray)0x0;
                          }
                          else {
                            local_28 = JNIEnv_::NewObjectArray
                                                 ((JNIEnv_ *)
                                                  CONCAT44(in_stack_ffffffffffffff04,
                                                           in_stack_00000030),
                                                  (jsize)((ulong)in_stack_00000028 >> 0x20),
                                                  in_stack_00000020,
                                                  (jobject)CONCAT44(in_stack_fffffffffffffeec,
                                                                    in_stack_00000018));
                            for (local_c4 = 0; (int)local_c4 < (int)plVar1[1];
                                local_c4 = local_c4 + 1) {
                              obj_00 = JNIEnv_::NewObject((JNIEnv_ *)in_RDI,clazz,methodID,
                                                          (ulong)local_c4);
                              JNIEnv_::CallVoidMethod
                                        ((JNIEnv_ *)in_RDI,obj_00,methodID_00,
                                         (ulong)*(uint *)(*plVar1 + (long)(int)local_c4 * 0x50));
                              p_Var4 = JNIEnv_::NewStringUTF
                                                 ((JNIEnv_ *)in_stack_00000020,
                                                  (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                                   in_stack_00000018));
                              JNIEnv_::CallVoidMethod((JNIEnv_ *)in_RDI,obj_00,methodID_01,p_Var4);
                              p_Var4 = JNIEnv_::NewStringUTF
                                                 ((JNIEnv_ *)in_stack_00000020,
                                                  (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                                   in_stack_00000018));
                              JNIEnv_::CallVoidMethod((JNIEnv_ *)in_RDI,obj_00,methodID_02,p_Var4);
                              JNIEnv_::CallVoidMethod
                                        ((JNIEnv_ *)in_RDI,obj_00,methodID_03,
                                         *(undefined8 *)
                                          (*plVar1 + (long)(int)local_c4 * 0x50 + 0x18));
                              JNIEnv_::CallVoidMethod
                                        ((JNIEnv_ *)in_RDI,obj_00,methodID_04,
                                         *(undefined8 *)
                                          (*plVar1 + (long)(int)local_c4 * 0x50 + 0x20));
                              JNIEnv_::CallVoidMethod
                                        ((JNIEnv_ *)in_RDI,obj_00,methodID_05,
                                         (ulong)*(uint *)(*plVar1 + (long)(int)local_c4 * 0x50 +
                                                         0x28));
                              p_Var4 = JNIEnv_::NewStringUTF
                                                 ((JNIEnv_ *)in_stack_00000020,
                                                  (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                                   in_stack_00000018));
                              JNIEnv_::CallVoidMethod((JNIEnv_ *)in_RDI,obj_00,methodID_06,p_Var4);
                              JNIEnv_::CallVoidMethod
                                        ((JNIEnv_ *)in_RDI,obj_00,methodID_07,
                                         *(undefined8 *)
                                          (*plVar1 + (long)(int)local_c4 * 0x50 + 0x38));
                              JNIEnv_::CallVoidMethod
                                        (*(JNIEnv_ **)(*plVar1 + (long)(int)local_c4 * 0x50 + 0x40),
                                         in_RDI,(jmethodID)obj_00,p_Var2);
                              JNIEnv_::CallVoidMethod
                                        (*(JNIEnv_ **)(*plVar1 + (long)(int)local_c4 * 0x50 + 0x48),
                                         in_RDI,(jmethodID)obj_00,p_Var3);
                              JNIEnv_::SetObjectArrayElement
                                        ((JNIEnv_ *)
                                         CONCAT44(in_stack_ffffffffffffff04,in_stack_00000030),
                                         (jobjectArray)in_stack_00000028,
                                         (jsize)((ulong)in_stack_00000020 >> 0x20),
                                         (jobject)CONCAT44(in_stack_fffffffffffffeec,
                                                           in_stack_00000018));
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_28;
}

Assistant:

JNIEXPORT jobjectArray JNICALL Java_beagle_BeagleJNIWrapper_getBenchmarkedResourceList
  (JNIEnv *env, jobject obj, jint tipCount, jint compactBufferCount, jint stateCount, jint patternCount, jint categoryCount, jintArray inResourceList, jint resourceCount, jlong preferenceFlags, jlong requirementFlags, jint eigenModelCount, jint partitionCount, jint calculateDerivatives, jlong benchmarkFlags)
{

    jint *resourceList = NULL;
    if (inResourceList != NULL)
        resourceList = env->GetIntArrayElements(inResourceList, NULL);

    BeagleBenchmarkedResourceList* brl =  beagleGetBenchmarkedResourceList(tipCount,
                                                               compactBufferCount,
                                                               stateCount,
                                                               patternCount,
                                                               categoryCount,
                                                               (int *)resourceList,
                                                               resourceCount,
                                                               preferenceFlags,
                                                               requirementFlags,
                                                               eigenModelCount,
                                                               partitionCount,
                                                               calculateDerivatives,
                                                               benchmarkFlags);

    if (brl == NULL) {
        return NULL;
    }

    jclass objClass = env->FindClass("beagle/BenchmarkedResourceDetails");
    if (objClass == NULL) {
        printf("NULL returned in FindClass: can't find class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID constructorMethodID = env->GetMethodID(objClass, "<init>","(I)V");
    if (constructorMethodID == NULL) {
        printf("NULL returned in FindClass: can't find constructor for class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setResourceNumberMethodID = env->GetMethodID(objClass, "setResourceNumber", "(I)V");
    if (setResourceNumberMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setResourceNumber' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setNameMethodID = env->GetMethodID(objClass, "setName", "(Ljava/lang/String;)V");
    if (setNameMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setName' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setDescriptionMethodID = env->GetMethodID(objClass, "setDescription", "(Ljava/lang/String;)V");
    if (setDescriptionMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setDescription' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setSupportFlagsMethodID = env->GetMethodID(objClass, "setSupportFlags", "(J)V");
    if (setSupportFlagsMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setSupportFlags' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setRequiredFlagsMethodID = env->GetMethodID(objClass, "setRequiredFlags", "(J)V");
    if (setRequiredFlagsMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setRequiredFlags' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setReturnCodeMethodID = env->GetMethodID(objClass, "setReturnCode", "(I)V");
    if (setReturnCodeMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setReturnCode' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setImplNameMethodID = env->GetMethodID(objClass, "setImplName", "(Ljava/lang/String;)V");
    if (setImplNameMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setImplName' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setBenchedFlagsMethodID = env->GetMethodID(objClass, "setBenchedFlags", "(J)V");
    if (setBenchedFlagsMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setBenchedFlags' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setBenchmarkResultMethodID = env->GetMethodID(objClass, "setBenchmarkResult", "(D)V");
    if (setBenchmarkResultMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setBenchmarkResult' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setPerformanceRatioMethodID = env->GetMethodID(objClass, "setPerformanceRatio", "(D)V");
    if (setPerformanceRatioMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setPerformanceRatio' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jobjectArray benchmarkedResourceArray = env->NewObjectArray(brl->length, objClass, NULL);

    for (int i = 0; i < brl->length; i++) {
        jobject benchmarkedResourceObj = env->NewObject(objClass, constructorMethodID, i);

        env->CallVoidMethod(benchmarkedResourceObj, setResourceNumberMethodID, brl->list[i].number);

        jstring jString = env->NewStringUTF(brl->list[i].name);
        env->CallVoidMethod(benchmarkedResourceObj, setNameMethodID, jString);

        jString = env->NewStringUTF(brl->list[i].description);
        env->CallVoidMethod(benchmarkedResourceObj, setDescriptionMethodID, jString);

        env->CallVoidMethod(benchmarkedResourceObj, setSupportFlagsMethodID, brl->list[i].supportFlags);

        env->CallVoidMethod(benchmarkedResourceObj, setRequiredFlagsMethodID, brl->list[i].requiredFlags);

        env->CallVoidMethod(benchmarkedResourceObj, setReturnCodeMethodID, brl->list[i].returnCode);

        jString = env->NewStringUTF(brl->list[i].implName);
        env->CallVoidMethod(benchmarkedResourceObj, setImplNameMethodID, jString);

        env->CallVoidMethod(benchmarkedResourceObj, setBenchedFlagsMethodID, brl->list[i].benchedFlags);

        env->CallVoidMethod(benchmarkedResourceObj, setBenchmarkResultMethodID, brl->list[i].benchmarkResult);

        env->CallVoidMethod(benchmarkedResourceObj, setPerformanceRatioMethodID, brl->list[i].performanceRatio);

        env->SetObjectArrayElement(benchmarkedResourceArray, i, benchmarkedResourceObj);
    }

    return benchmarkedResourceArray;
}